

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readMasterJournal(sqlite3_file *pJrnl,char *zMaster,u32 nMaster)

{
  long in_FS_OFFSET;
  uint local_50;
  u32 local_4c;
  u32 u;
  u32 cksum;
  i64 szJ;
  int local_38;
  u32 len;
  int rc;
  u32 nMaster_local;
  char *zMaster_local;
  sqlite3_file *pJrnl_local;
  long local_18;
  uchar aMagic [8];
  
  aMagic = *(uchar (*) [8])(in_FS_OFFSET + 0x28);
  *zMaster = '\0';
  len = nMaster;
  _rc = zMaster;
  zMaster_local = (char *)pJrnl;
  local_38 = sqlite3OsFileSize(pJrnl,(i64 *)&u);
  if ((local_38 == 0) && (0xf < _u)) {
    local_38 = read32bits((sqlite3_file *)zMaster_local,_u + -0x10,(u32 *)((long)&szJ + 4));
    if ((local_38 == 0) && ((szJ._4_4_ < len && (szJ._4_4_ != 0)))) {
      local_38 = read32bits((sqlite3_file *)zMaster_local,_u + -0xc,&local_4c);
      if (local_38 == 0) {
        local_38 = sqlite3OsRead((sqlite3_file *)zMaster_local,&local_18,8,_u + -8);
        if ((local_38 == 0) && (local_18 == -0x289c5edf06fa2a27)) {
          local_38 = sqlite3OsRead((sqlite3_file *)zMaster_local,_rc,szJ._4_4_,
                                   (_u + -0x10) - (ulong)szJ._4_4_);
          if (local_38 == 0) {
            for (local_50 = 0; local_50 < szJ._4_4_; local_50 = local_50 + 1) {
              local_4c = local_4c - (int)_rc[local_50];
            }
            if (local_4c != 0) {
              szJ._4_4_ = 0;
            }
            _rc[szJ._4_4_] = '\0';
            pJrnl_local._4_4_ = 0;
            goto LAB_003f85c9;
          }
        }
      }
    }
  }
  pJrnl_local._4_4_ = local_38;
LAB_003f85c9:
  if (*(uchar (*) [8])(in_FS_OFFSET + 0x28) == aMagic) {
    return pJrnl_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int readMasterJournal(sqlite3_file *pJrnl, char *zMaster, u32 nMaster){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of master journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zMaster[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nMaster 
   || len==0 
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zMaster, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the master journal name */
  for(u=0; u<len; u++){
    cksum -= zMaster[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the master journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** master-journal filename.
    */
    len = 0;
  }
  zMaster[len] = '\0';
   
  return SQLITE_OK;
}